

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshSelectWeights5(word *t,int nVars,int *pW)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int Cost;
  int iVar4;
  uint uVar5;
  int Cost_1;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  bool bVar12;
  
  if (nVars != 5) {
    __assert_fail("nVars == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0xd8,"int Extra_ThreshSelectWeights5(word *, int, int *)");
  }
  pW[4] = 1;
  uVar5 = 1;
  do {
    pW[3] = uVar5;
    uVar8 = uVar5;
    do {
      pW[2] = uVar8;
      uVar1 = uVar8;
      do {
        pW[1] = uVar1;
        uVar2 = uVar1;
        do {
          *pW = uVar2;
          uVar3 = uVar2;
          do {
            iVar4 = 10000;
            uVar10 = 0;
            iVar6 = 0;
            while( true ) {
              uVar9 = (uint)uVar10;
              if ((t[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
                lVar11 = 0;
                iVar7 = 0;
                do {
                  if ((uVar9 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                    iVar7 = iVar7 + pW[lVar11];
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 5);
                if (iVar6 <= iVar7) {
                  iVar6 = iVar7;
                }
              }
              else {
                lVar11 = 0;
                iVar7 = 0;
                do {
                  if ((uVar9 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                    iVar7 = iVar7 + pW[lVar11];
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 5);
                if (iVar7 <= iVar4) {
                  iVar4 = iVar7;
                }
              }
              if (iVar4 <= iVar6) break;
              uVar10 = (ulong)(uVar9 + 1);
              if (uVar9 + 1 == 0x20) {
                return iVar4;
              }
            }
            *pW = uVar3 + 1;
            bVar12 = uVar3 < 5;
            uVar3 = uVar3 + 1;
          } while (bVar12);
          pW[1] = uVar2 + 1;
          bVar12 = uVar2 < 5;
          uVar2 = uVar2 + 1;
        } while (bVar12);
        pW[2] = uVar1 + 1;
        bVar12 = uVar1 < 5;
        uVar1 = uVar1 + 1;
      } while (bVar12);
      uVar8 = uVar8 + 1;
      pW[3] = uVar8;
    } while (uVar8 != 6);
    uVar5 = uVar5 + 1;
    pW[4] = uVar5;
    if (uVar5 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights5(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 0;
    assert(nVars == 5);
    for (pW[4] = 1; pW[4] <= Limit; pW[4]++)
        for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
            for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                    for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                        Lmin = 10000;
                        Lmax = 0;
                        for (m = 0; m < nMints; m++) {
                            if (Abc_TtGetBit(t, m))
                                Lmin = Abc_MinInt(Lmin,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            else
                                Lmax = Abc_MaxInt(Lmax,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            if (Lmax >= Lmin)
                                break;
                        }
                        if (m < nMints)
                            continue;
                        assert(Lmax < Lmin);
                        return Lmin;
                    }
    return 0;
}